

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cc
# Opt level: O0

Status __thiscall
leveldb::SetCurrentFile(leveldb *this,Env *env,string *dbname,uint64_t descriptor_number)

{
  bool bVar1;
  long lVar2;
  Status local_140;
  leveldb local_138 [32];
  Status local_118;
  Slice local_110 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0 [32];
  Slice local_d0;
  undefined1 local_b9;
  leveldb local_b8 [8];
  string tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  Slice local_78 [2];
  undefined1 local_58 [8];
  Slice contents;
  string manifest;
  uint64_t descriptor_number_local;
  string *dbname_local;
  Env *env_local;
  Status *s;
  
  DescriptorFileName((leveldb *)&contents.size_,dbname,descriptor_number);
  Slice::Slice((Slice *)local_58,(string *)&contents.size_);
  std::operator+(local_98,(char *)dbname);
  Slice::Slice(local_78,local_98);
  bVar1 = Slice::starts_with((Slice *)local_58,local_78);
  if (!bVar1) {
    __assert_fail("contents.starts_with(dbname + \"/\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/filename.cc"
                  ,0x80,"Status leveldb::SetCurrentFile(Env *, const std::string &, uint64_t)");
  }
  std::__cxx11::string::~string((string *)local_98);
  lVar2 = std::__cxx11::string::size();
  Slice::remove_prefix((Slice *)local_58,lVar2 + 1);
  TempFileName(local_b8,dbname,descriptor_number);
  local_b9 = 0;
  Slice::ToString_abi_cxx11_(local_110);
  std::operator+(local_f0,(char *)local_110);
  Slice::Slice(&local_d0,local_f0);
  WriteStringToFileSync(this,env,&local_d0,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_110);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    CurrentFileName(local_138,dbname);
    (*env->_vptr_Env[0xc])(&local_118,env,local_b8,local_138);
    Status::operator=((Status *)this,&local_118);
    Status::~Status(&local_118);
    std::__cxx11::string::~string((string *)local_138);
  }
  bVar1 = Status::ok((Status *)this);
  if (!bVar1) {
    (*env->_vptr_Env[8])(&local_140,env,local_b8);
    Status::~Status(&local_140);
  }
  local_b9 = 1;
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)&contents.size_);
  return (Status)(char *)this;
}

Assistant:

Status SetCurrentFile(Env* env, const std::string& dbname,
                      uint64_t descriptor_number) {
  // Remove leading "dbname/" and add newline to manifest file name
  std::string manifest = DescriptorFileName(dbname, descriptor_number);
  Slice contents = manifest;
  assert(contents.starts_with(dbname + "/"));
  contents.remove_prefix(dbname.size() + 1);
  std::string tmp = TempFileName(dbname, descriptor_number);
  Status s = WriteStringToFileSync(env, contents.ToString() + "\n", tmp);
  if (s.ok()) {
    s = env->RenameFile(tmp, CurrentFileName(dbname));
  }
  if (!s.ok()) {
    env->DeleteFile(tmp);
  }
  return s;
}